

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_check_typedef(lys_module *module,lys_node *parent,unres_schema *unres)

{
  byte size;
  LYS_NODE LVar1;
  lys_tpdf *tpdf;
  uint8_t start;
  int iVar2;
  lys_node *plVar3;
  LY_ERR *pLVar4;
  long lVar5;
  lys_type *type;
  uint8_t *puVar6;
  
  if (parent == (lys_node *)0x0) {
    plVar3 = (lys_node *)&module->tpdf;
    puVar6 = &module->tpdf_size;
    goto LAB_00153292;
  }
  LVar1 = parent->nodetype;
  if ((int)LVar1 < 0x200) {
    if ((int)LVar1 < 0x80) {
      if (LVar1 != LYS_CONTAINER) {
        if (LVar1 == LYS_LIST) {
          plVar3 = (lys_node *)&parent[1].ref;
          puVar6 = parent->padding + 1;
          goto LAB_00153292;
        }
        goto LAB_001533e3;
      }
      plVar3 = (lys_node *)&parent[1].ref;
LAB_0015328e:
      puVar6 = parent->padding + 3;
    }
    else {
      if (LVar1 != LYS_NOTIF) {
        if (LVar1 == LYS_RPC) goto LAB_00153284;
        goto LAB_001533e3;
      }
LAB_00153268:
      plVar3 = parent + 1;
      puVar6 = parent->padding + 2;
    }
LAB_00153292:
    tpdf = (lys_tpdf *)plVar3->name;
    size = *puVar6;
    *puVar6 = 0;
    if (size != 0) {
      lVar5 = 0;
      start = '\0';
      do {
        iVar2 = lyp_check_identifier
                          (*(char **)(tpdf->padding + lVar5 + -0x1c),LY_IDENT_TYPE,module,parent);
        if (iVar2 != 0) {
LAB_001533b1:
          yang_tpdf_free(module->ctx,tpdf,start,size);
          goto LAB_001533c3;
        }
        type = (lys_type *)(tpdf->padding + lVar5 + 0x1c);
        iVar2 = yang_fill_type(module,type,*(yang_type **)(tpdf->padding + lVar5 + 0x34),
                               tpdf->padding + lVar5 + -0x1c,unres);
        if (((iVar2 != 0) ||
            (iVar2 = yang_check_ext_instance
                               (module,(lys_ext_instance ***)(tpdf->padding + lVar5 + 4),
                                (uint)tpdf->padding[lVar5 + -2],tpdf->padding + lVar5 + -0x1c,unres)
            , iVar2 != 0)) ||
           (iVar2 = unres_schema_add_node(module,unres,type,UNRES_TYPE_DER_TPDF,parent), iVar2 == -1
           )) goto LAB_001533b1;
        *puVar6 = *puVar6 + 1;
        iVar2 = unres_schema_add_node
                          (module,unres,type,UNRES_TYPEDEF_DFLT,
                           (lys_node *)(tpdf->padding + lVar5 + 0x5c));
        if (iVar2 == -1) {
          start = start + '\x01';
          goto LAB_001533b1;
        }
        start = start + '\x01';
        lVar5 = lVar5 + 0x80;
      } while ((ulong)size << 7 != lVar5);
    }
    iVar2 = 0;
  }
  else {
    if ((int)LVar1 < 0x800) {
      if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) goto LAB_00153268;
    }
    else if ((LVar1 == LYS_ACTION) || (LVar1 == LYS_GROUPING)) {
LAB_00153284:
      plVar3 = parent + 1;
      goto LAB_0015328e;
    }
LAB_001533e3:
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
           ,0xdf2);
LAB_001533c3:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
yang_check_typedef(struct lys_module *module, struct lys_node *parent, struct unres_schema *unres)
{
    struct lys_tpdf *tpdf;
    uint8_t i, tpdf_size, *ptr_tpdf_size;

    if (!parent) {
        tpdf = module->tpdf;
        ptr_tpdf_size = &module->tpdf_size;
    } else {
        switch (parent->nodetype) {
        case LYS_GROUPING:
            tpdf = ((struct lys_node_grp *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_grp *)parent)->tpdf_size;
            break;
        case LYS_CONTAINER:
            tpdf = ((struct lys_node_container *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_container *)parent)->tpdf_size;
            break;
        case LYS_LIST:
            tpdf = ((struct lys_node_list *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_list *)parent)->tpdf_size;
            break;
        case LYS_RPC:
        case LYS_ACTION:
            tpdf = ((struct lys_node_rpc_action *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_rpc_action *)parent)->tpdf_size;
            break;
        case LYS_INPUT:
        case LYS_OUTPUT:
            tpdf = ((struct lys_node_inout *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_inout *)parent)->tpdf_size;
            break;
        case LYS_NOTIF:
            tpdf = ((struct lys_node_notif *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_notif *)parent)->tpdf_size;
            break;
        default:
            LOGINT;
            return EXIT_FAILURE;
        }
    }

    tpdf_size = *ptr_tpdf_size;
    *ptr_tpdf_size = 0;

    for (i = 0; i < tpdf_size; ++i) {
        if (lyp_check_identifier(tpdf[i].name, LY_IDENT_TYPE, module, parent)) {
            goto error;
        }

        if (yang_fill_type(module, &tpdf[i].type, (struct yang_type *)tpdf[i].type.der, &tpdf[i], unres)) {
            goto error;
        }
        if (yang_check_ext_instance(module, &tpdf[i].ext, tpdf[i].ext_size, &tpdf[i], unres)) {
            goto error;
        }
        if (unres_schema_add_node(module, unres, &tpdf[i].type, UNRES_TYPE_DER_TPDF, parent) == -1) {
            goto error;
        }

        (*ptr_tpdf_size)++;
        /* check default value*/
        if (unres_schema_add_node(module, unres, &tpdf[i].type, UNRES_TYPEDEF_DFLT,
                                  (struct lys_node *)(&tpdf[i].dflt)) == -1)  {
            ++i;
            goto error;
        }
    }

    return EXIT_SUCCESS;

error:
    yang_tpdf_free(module->ctx, tpdf, i, tpdf_size);
    return EXIT_FAILURE;
}